

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O0

void more(void)

{
  wchar_t wVar1;
  bool bVar2;
  int local_6c;
  int local_5c;
  int local_54;
  int local_50;
  int local_4c;
  int local_3c;
  int local_2c;
  int local_1c;
  undefined4 local_18;
  attr_t attr;
  int cursy;
  int cursx;
  int key;
  
  local_18 = 0;
  if (skip_more == '\0') {
    draw_msgwin();
    if (settings.standout != '\0') {
      local_18 = 0x10000;
    }
    if (msgwin == (WINDOW_conflict *)0x0) {
      local_1c = -1;
    }
    else {
      local_1c = msgwin->_maxy + 1;
    }
    if (local_1c == 1) {
      if (msgwin == (WINDOW_conflict *)0x0) {
        local_2c = -1;
      }
      else {
        local_2c = msgwin->_maxy + 1;
      }
      wmove(msgwin,local_2c + -1,0x48);
      wattr_on(msgwin,local_18,0);
      waddnstr(msgwin,"--More--",0xffffffff);
      wattr_off(msgwin,local_18,0);
      wrefresh(msgwin);
    }
    else {
      newline();
      draw_msgwin();
      if (msgwin == (WINDOW_conflict *)0x0) {
        local_3c = -1;
      }
      else {
        local_3c = msgwin->_maxy + 1;
      }
      wmove(msgwin,local_3c + -1,0);
      wclrtoeol(msgwin);
      if (msgwin == (WINDOW_conflict *)0x0) {
        local_4c = -1;
      }
      else {
        local_4c = msgwin->_maxy + 1;
      }
      wmove(msgwin,local_4c + -1,0x24);
      wattr_on(msgwin,local_18,0);
      waddnstr(msgwin,"--More--",0xffffffff);
      wattr_off(msgwin,local_18,0);
      wrefresh(msgwin);
    }
    if (msgwin == (WINDOW_conflict *)0x0) {
      local_50 = -1;
      local_54 = -1;
    }
    else {
      local_50 = (int)msgwin->_cury;
      local_54 = (int)msgwin->_curx;
    }
    do {
      wVar1 = nh_wgetch(msgwin);
      draw_map(player.x,player.y);
      wmove(msgwin,local_50,local_54);
      doupdate();
      bVar2 = false;
      if (((wVar1 != L'\n') && (bVar2 = false, wVar1 != L'\r')) && (bVar2 = false, wVar1 != L' ')) {
        bVar2 = wVar1 != L'\x1b';
      }
    } while (bVar2);
    if (msgwin == (WINDOW_conflict *)0x0) {
      local_5c = -1;
    }
    else {
      local_5c = msgwin->_maxy + 1;
    }
    if (local_5c == 1) {
      newline();
    }
    else {
      if (msgwin == (WINDOW_conflict *)0x0) {
        local_6c = -1;
      }
      else {
        local_6c = msgwin->_maxy + 1;
      }
      wmove(msgwin,local_6c + -1,0);
      wclrtoeol(msgwin);
    }
    draw_msgwin();
    if (wVar1 == L'\x1b') {
      skip_more = '\x01';
    }
    last_redraw_curline = curline;
  }
  return;
}

Assistant:

static void more(void)
{
    int key;
    int cursx, cursy;
    attr_t attr = A_NORMAL;

    if (skip_more)
	return;

    draw_msgwin();

    if (settings.standout)
	attr = A_STANDOUT;

    if (getmaxy(msgwin) == 1) {
	wmove(msgwin, getmaxy(msgwin)-1, COLNO-8);
	wattron(msgwin, attr);
	waddstr(msgwin, "--More--");
	wattroff(msgwin, attr);
	wrefresh(msgwin);
    } else {
	newline();
	draw_msgwin();
	wmove(msgwin, getmaxy(msgwin)-1, 0);
	wclrtoeol(msgwin);
	wmove(msgwin, getmaxy(msgwin)-1, COLNO/2 - 4);
	wattron(msgwin, attr);
	waddstr(msgwin, "--More--");
	wattroff(msgwin, attr);
	wrefresh(msgwin);
    }

    getyx(msgwin, cursy, cursx);
    do {
	key = nh_wgetch(msgwin);
	draw_map(player.x, player.y);
	wmove(msgwin, cursy, cursx);
	doupdate();
    } while (key != '\n' && key != '\r' && key != ' ' && key != KEY_ESC);

    /* Clean up after the --More--. */
    if (getmaxy(msgwin) == 1) {
	newline();
    } else {
	wmove(msgwin, getmaxy(msgwin)-1, 0);
	wclrtoeol(msgwin);
    }
    draw_msgwin();

    if (key == KEY_ESC)
	skip_more = TRUE;

    /* we want to --more-- by screenfuls, not lines */
    last_redraw_curline = curline;
}